

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O3

void av1_prune_ab_partitions
               (AV1_COMP *cpi,MACROBLOCK *x,PC_TREE *pc_tree,int pb_source_variance,
               int64_t best_rdcost,RD_RECT_PART_WIN_INFO *rect_part_win_info,
               _Bool ext_partition_allowed,PartitionSearchState *part_state,
               int *ab_partitions_allowed)

{
  ExtPartController *ext_part_controller;
  PARTITION_TYPE PVar1;
  BLOCK_SIZE BVar2;
  int iVar3;
  bool bVar4;
  _Bool _Var5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  uint *puVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  uint uVar25;
  uint uVar26;
  uint uVar27;
  float features [10];
  int sub_block_rdcost [8];
  int int_score [16];
  float score [16];
  float local_2bc8;
  float fStack_2bc4;
  float fStack_2bc0;
  uint uStack_2bbc;
  float local_2bb8 [4];
  float local_2ba8 [4];
  uint local_2b98 [8];
  aom_partition_features_t local_2b78;
  aom_partition_decision_t local_2078;
  
  uVar17 = 0;
  if (ext_partition_allowed) {
    uVar15 = 0;
    if ((cpi->oxcf).part_cfg.enable_ab_partitions == true) {
      uVar17 = (uint)(part_state->partition_rect_allowed[0] != 0);
      uVar15 = (uint)(part_state->partition_rect_allowed[1] != 0);
    }
  }
  else {
    uVar15 = 0;
  }
  iVar10 = (cpi->sf).part_sf.prune_ext_partition_types_search_level;
  if (iVar10 != 0) {
    if (iVar10 == 1) {
      PVar1 = pc_tree->partitioning;
      uVar6 = 1;
      if (PVar1 == '\x01') {
LAB_00a593c9:
        uVar7 = (uint)(PVar1 == '\x03');
      }
      else {
        uVar7 = 1;
        if (pb_source_variance < 0x20 && PVar1 == '\0') {
          uVar6 = 1;
        }
        else {
          uVar6 = (uint)(PVar1 == '\x03');
          if (PVar1 != '\x02') goto LAB_00a593c9;
        }
      }
    }
    else {
      PVar1 = pc_tree->partitioning;
      uVar7 = (uint)(PVar1 == '\x03');
      uVar6 = uVar7;
      if (PVar1 == '\x01') {
        uVar6 = 1;
      }
      if (PVar1 == '\x02') {
        uVar7 = 1;
      }
    }
    uVar17 = uVar17 & uVar6;
    uVar15 = uVar15 & uVar7;
    lVar14 = part_state->rect_part_rd[0][0];
    lVar11 = 0;
    if (lVar14 == 0x7fffffffffffffff) {
      lVar14 = lVar11;
    }
    part_state->rect_part_rd[0][0] = lVar14;
    lVar14 = part_state->rect_part_rd[0][1];
    if (lVar14 == 0x7fffffffffffffff) {
      lVar14 = lVar11;
    }
    part_state->rect_part_rd[0][1] = lVar14;
    lVar14 = part_state->rect_part_rd[1][0];
    if (lVar14 == 0x7fffffffffffffff) {
      lVar14 = lVar11;
    }
    part_state->rect_part_rd[1][0] = lVar14;
    lVar14 = part_state->rect_part_rd[1][1];
    if (lVar14 == 0x7fffffffffffffff) {
      lVar14 = lVar11;
    }
    part_state->rect_part_rd[1][1] = lVar14;
    lVar14 = part_state->split_rd[0];
    if (part_state->split_rd[0] == 0x7fffffffffffffff) {
      lVar14 = lVar11;
    }
    lVar16 = part_state->split_rd[1];
    if (part_state->split_rd[1] == 0x7fffffffffffffff) {
      lVar16 = lVar11;
    }
    part_state->split_rd[0] = lVar14;
    part_state->split_rd[1] = lVar16;
    lVar14 = part_state->split_rd[2];
    if (part_state->split_rd[2] == 0x7fffffffffffffff) {
      lVar14 = lVar11;
    }
    part_state->split_rd[2] = lVar14;
    lVar14 = part_state->split_rd[3];
    if (part_state->split_rd[3] == 0x7fffffffffffffff) {
      lVar14 = lVar11;
    }
    part_state->split_rd[3] = lVar14;
  }
  *ab_partitions_allowed = uVar17;
  ab_partitions_allowed[1] = uVar17;
  iVar10 = (cpi->sf).part_sf.prune_ext_partition_types_search_level;
  uVar6 = uVar17;
  if (iVar10 != 0) {
    lVar11 = part_state->split_rd[0] + part_state->rect_part_rd[0][1];
    lVar14 = lVar11 + part_state->split_rd[1];
    lVar16 = part_state->split_rd[2] + part_state->rect_part_rd[0][0];
    lVar11 = part_state->split_rd[1] + lVar11 + 0xf;
    if (-1 < lVar14) {
      lVar11 = lVar14;
    }
    lVar14 = lVar16 + part_state->split_rd[3];
    lVar16 = part_state->split_rd[3] + lVar16 + 0xf;
    if (-1 < lVar14) {
      lVar16 = lVar14;
    }
    uVar18 = (ulong)(iVar10 == 1) ^ 0xf;
    uVar6 = 0;
    if ((long)((lVar11 >> 4) * uVar18) < best_rdcost) {
      uVar6 = uVar17;
    }
    if (best_rdcost <= (long)(uVar18 * (lVar16 >> 4))) {
      uVar17 = 0;
    }
    *ab_partitions_allowed = uVar6;
    ab_partitions_allowed[1] = uVar17;
  }
  ab_partitions_allowed[2] = uVar15;
  ab_partitions_allowed[3] = uVar15;
  iVar10 = (cpi->sf).part_sf.prune_ext_partition_types_search_level;
  uVar7 = uVar15;
  if (iVar10 != 0) {
    lVar16 = part_state->split_rd[0] + part_state->rect_part_rd[1][1];
    lVar14 = lVar16 + part_state->split_rd[2];
    lVar13 = part_state->split_rd[1] + part_state->rect_part_rd[1][0];
    lVar11 = lVar13 + part_state->split_rd[3];
    lVar16 = part_state->split_rd[2] + lVar16 + 0xf;
    if (-1 < lVar14) {
      lVar16 = lVar14;
    }
    lVar14 = part_state->split_rd[3] + lVar13 + 0xf;
    if (-1 < lVar11) {
      lVar14 = lVar11;
    }
    uVar18 = (ulong)(iVar10 == 1) ^ 0xf;
    uVar8 = 0;
    if ((long)((lVar16 >> 4) * uVar18) < best_rdcost) {
      uVar8 = uVar15;
    }
    uVar7 = 0;
    if ((long)(uVar18 * (lVar14 >> 4)) < best_rdcost) {
      uVar7 = uVar15;
    }
    ab_partitions_allowed[2] = uVar8;
    ab_partitions_allowed[3] = uVar7;
    uVar15 = uVar8;
  }
  if (((ext_partition_allowed && (cpi->sf).part_sf.ml_prune_partition != 0) &&
      (part_state->partition_rect_allowed[0] != 0)) && (part_state->partition_rect_allowed[1] != 0))
  {
    uVar8 = x->source_variance;
    uVar25 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    iVar10 = (uVar25 ^ 0xffffffe0) + 0x21;
    if (uVar8 == 0) {
      iVar10 = 0;
    }
    BVar2 = (part_state->part_blk_params).bsize;
    if (((best_rdcost < 1000000000 && BLOCK_8X4 < BVar2) && (uVar8 = BVar2 - 6, (byte)uVar8 < 10))
       && ((0x249U >> (uVar8 & 0x1f) & 1) != 0)) {
      iVar3 = *(int *)(&DAT_00d871f8 + (ulong)(uVar8 & 0xff) * 4);
      local_2bc8 = (float)pc_tree->partitioning;
      fStack_2bc4 = (float)iVar10;
      local_2b98[4] = 0;
      local_2b98[5] = 0;
      local_2b98[6] = 0;
      local_2b98[7] = 0;
      local_2b98[0] = 0;
      local_2b98[1] = 0;
      local_2b98[2] = 0;
      local_2b98[3] = 0;
      lVar14 = 0;
      puVar12 = local_2b98;
      bVar4 = true;
      do {
        bVar9 = bVar4;
        lVar14 = part_state->rect_part_rd[0][lVar14];
        uVar18 = lVar14 - 1;
        if (uVar18 < 999999999) {
          *puVar12 = (uint)lVar14;
        }
        lVar14 = 1;
        puVar12 = local_2b98 + 1;
        bVar4 = false;
      } while (bVar9);
      lVar14 = 2;
      lVar11 = 0;
      do {
        lVar11 = part_state->rect_part_rd[1][lVar11];
        if (lVar11 - 1U < 999999999) {
          local_2b98[lVar14] = (uint)lVar11;
        }
        lVar14 = lVar14 + 1;
        lVar11 = 1;
      } while (lVar14 != 4);
      lVar14 = 0;
      do {
        if (part_state->split_rd[lVar14] - 1U < 999999999) {
          local_2b98[lVar14 + 4] = (uint)part_state->split_rd[lVar14];
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      iVar10 = (int)best_rdcost;
      auVar19._0_4_ = (float)iVar10;
      auVar19._4_4_ = auVar19._0_4_;
      auVar19._8_4_ = auVar19._0_4_;
      auVar19._12_4_ = auVar19._0_4_;
      lVar14 = 0;
      do {
        uVar17 = local_2b98[lVar14];
        uVar15 = local_2b98[lVar14 + 1];
        uVar6 = local_2b98[lVar14 + 2];
        uVar7 = local_2b98[lVar14 + 3];
        uVar8 = -(uint)((int)uVar17 < iVar10 && 0 < (int)uVar17);
        uVar25 = -(uint)((int)uVar15 < iVar10 && 0 < (int)uVar15);
        uVar26 = -(uint)((int)uVar6 < iVar10 && 0 < (int)uVar6);
        uVar27 = -(uint)((int)uVar7 < iVar10 && 0 < (int)uVar7);
        auVar24._0_4_ =
             ((float)(uVar17 >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(uVar17 & 0xffff | 0x4b000000);
        auVar24._4_4_ =
             ((float)(uVar15 >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(uVar15 & 0xffff | 0x4b000000);
        auVar24._8_4_ =
             ((float)(uVar6 >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(uVar6 & 0xffff | 0x4b000000);
        auVar24._12_4_ =
             ((float)(uVar7 >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(uVar7 & 0xffff | 0x4b000000);
        auVar24 = divps(auVar24,auVar19);
        (&fStack_2bc0)[lVar14] = (float)(~uVar8 & 0x3f800000 | auVar24._0_4_ & uVar8);
        (&uStack_2bbc)[lVar14] = ~uVar25 & 0x3f800000 | auVar24._4_4_ & uVar25;
        local_2bb8[lVar14] = (float)(~uVar26 & 0x3f800000 | auVar24._8_4_ & uVar26);
        local_2bb8[lVar14 + 1] = (float)(~uVar27 & 0x3f800000 | auVar24._12_4_ & uVar27);
        lVar14 = lVar14 + 4;
      } while (lVar14 != 8);
      if (((((cpi->common).current_frame.frame_type & 0xfd) != 0) &&
          (write_features_to_file
                     ((cpi->oxcf).partition_info_path,(cpi->ext_part_controller).test_mode != 0,
                      &local_2bc8,10,6,(BLOCK_SIZE)uVar18,(int)pc_tree,(int)x),
          ((cpi->common).current_frame.frame_type & 0xfd) != 0)) &&
         (ext_part_controller = &cpi->ext_part_controller, ext_part_controller->ready != 0)) {
        local_2b78.id = AOM_EXT_PART_FEATURE_AFTER_RECT;
        local_2b78.after_part_rect.f[1] = fStack_2bc4;
        local_2b78.after_part_rect.f[0] = local_2bc8;
        local_2b78.after_part_rect.f[2] = fStack_2bc0;
        local_2b78.after_part_rect.f[3] = (float)uStack_2bbc;
        local_2b78.after_part_rect.f[4] = local_2bb8[0];
        local_2b78.after_part_rect.f[5] = local_2bb8[1];
        local_2b78.after_part_rect.f[6] = local_2bb8[2];
        local_2b78.after_part_rect.f[7] = local_2bb8[3];
        local_2b78.after_part_rect.f[8] = local_2ba8[0];
        local_2b78.after_part_rect.f[9] = local_2ba8[1];
        av1_ext_part_send_features(ext_part_controller,&local_2b78);
        _Var5 = av1_ext_part_get_partition_decision(ext_part_controller,&local_2078);
        if (_Var5) {
          *ab_partitions_allowed = local_2078.horza_partition_allowed;
          ab_partitions_allowed[1] = local_2078.horzb_partition_allowed;
          ab_partitions_allowed[2] = local_2078.verta_partition_allowed;
          ab_partitions_allowed[3] = local_2078.vertb_partition_allowed;
          uVar6 = local_2078.horza_partition_allowed;
          uVar15 = local_2078.verta_partition_allowed;
          uVar7 = local_2078.vertb_partition_allowed;
          uVar17 = local_2078.horzb_partition_allowed;
          goto LAB_00a59a5c;
        }
      }
      local_2078.partition_decision[10] = 0;
      local_2078.partition_decision[0xb] = 0;
      local_2078.partition_decision[0xc] = 0;
      local_2078.partition_decision[0xd] = 0;
      local_2078.partition_decision[6] = 0;
      local_2078.partition_decision[7] = 0;
      local_2078.partition_decision[8] = 0;
      local_2078.partition_decision[9] = 0;
      local_2078.partition_decision[2] = 0;
      local_2078.partition_decision[3] = 0;
      local_2078.partition_decision[4] = 0;
      local_2078.partition_decision[5] = 0;
      local_2078.is_final_decision = 0;
      local_2078.num_nodes = 0;
      local_2078.partition_decision[0] = 0;
      local_2078.partition_decision[1] = 0;
      (*av1_nn_predict)(&local_2bc8,(NN_CONFIG *)(&DAT_00d871f8 + iVar3),1,(float *)&local_2078);
      uVar17 = 0xfffffc18;
      uVar15 = 0xfffffc18;
      uVar6 = 0xfffffc18;
      uVar7 = 0xfffffc18;
      lVar14 = 0;
      do {
        fVar20 = (float)(int)((float)local_2078.partition_decision[lVar14 + -2] * 100.0);
        fVar21 = (float)(int)((float)local_2078.partition_decision[lVar14 + -1] * 100.0);
        fVar22 = (float)(int)((float)local_2078.partition_decision[lVar14] * 100.0);
        fVar23 = (float)(int)((float)local_2078.partition_decision[lVar14 + 1] * 100.0);
        local_2b78.before_part_none.f[lVar14 + -1] = fVar20;
        local_2b78.before_part_none.f[lVar14] = fVar21;
        local_2b78.before_part_none.f[lVar14 + 1] = fVar22;
        local_2b78.before_part_none.f[lVar14 + 2] = fVar23;
        uVar17 = ~-(uint)((int)fVar20 < (int)uVar17) & (uint)fVar20 |
                 uVar17 & -(uint)((int)fVar20 < (int)uVar17);
        uVar15 = ~-(uint)((int)fVar21 < (int)uVar15) & (uint)fVar21 |
                 uVar15 & -(uint)((int)fVar21 < (int)uVar15);
        uVar6 = ~-(uint)((int)fVar22 < (int)uVar6) & (uint)fVar22 |
                uVar6 & -(uint)((int)fVar22 < (int)uVar6);
        uVar7 = ~-(uint)((int)fVar23 < (int)uVar7) & (uint)fVar23 |
                uVar7 & -(uint)((int)fVar23 < (int)uVar7);
        lVar14 = lVar14 + 4;
      } while (lVar14 != 0x10);
      uVar6 = ~-(uint)((int)uVar6 < (int)uVar17) & uVar6 |
              uVar17 & -(uint)((int)uVar6 < (int)uVar17);
      uVar15 = ~-(uint)((int)uVar7 < (int)uVar15) & uVar7 |
               uVar15 & -(uint)((int)uVar7 < (int)uVar15);
      uVar17 = -(uint)((int)uVar15 < (int)uVar6);
      uVar8 = ~uVar17 & uVar15 | uVar6 & uVar17;
      if (BVar2 == BLOCK_32X32) {
        uVar8 = uVar8 - 100;
      }
      else if (BVar2 == BLOCK_16X16) {
        uVar8 = uVar8 - 0x96;
      }
      ab_partitions_allowed[0] = 0;
      ab_partitions_allowed[1] = 0;
      ab_partitions_allowed[2] = 0;
      ab_partitions_allowed[3] = 0;
      uVar7 = 0;
      uVar15 = 0;
      uVar17 = 0;
      uVar6 = 0;
      uVar18 = 0;
      do {
        if ((int)uVar8 <= (int)local_2b78.before_part_none.f[uVar18 - 1]) {
          if ((uVar18 & 1) != 0) {
            *ab_partitions_allowed = 1;
            uVar6 = 1;
          }
          if ((uVar18 & 2) != 0) {
            ab_partitions_allowed[1] = 1;
            uVar17 = 1;
          }
          if ((uVar18 & 4) != 0) {
            ab_partitions_allowed[2] = 1;
            uVar15 = 1;
          }
          if (7 < uVar18) {
            ab_partitions_allowed[3] = 1;
            uVar7 = 1;
          }
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != 0x10);
    }
  }
LAB_00a59a5c:
  if (1 < (cpi->sf).part_sf.prune_ext_part_using_split_info) {
    if (uVar6 != 0) {
      uVar8 = evaluate_ab_partition_based_on_split(pc_tree,'\x01',rect_part_win_info,x->qindex,0,1);
      *ab_partitions_allowed = uVar8 & uVar6;
      if ((cpi->sf).part_sf.prune_ext_part_using_split_info < 2) {
        return;
      }
    }
    if (uVar17 != 0) {
      uVar6 = evaluate_ab_partition_based_on_split(pc_tree,'\x01',rect_part_win_info,x->qindex,2,3);
      ab_partitions_allowed[1] = uVar6 & uVar17;
      if ((cpi->sf).part_sf.prune_ext_part_using_split_info < 2) {
        return;
      }
    }
    if (uVar15 != 0) {
      uVar17 = evaluate_ab_partition_based_on_split(pc_tree,'\x02',rect_part_win_info,x->qindex,0,2)
      ;
      ab_partitions_allowed[2] = uVar17 & uVar15;
      if ((cpi->sf).part_sf.prune_ext_part_using_split_info < 2) {
        return;
      }
    }
    if (uVar7 != 0) {
      uVar17 = evaluate_ab_partition_based_on_split(pc_tree,'\x02',rect_part_win_info,x->qindex,1,3)
      ;
      ab_partitions_allowed[3] = uVar17 & uVar7;
    }
  }
  return;
}

Assistant:

void av1_prune_ab_partitions(AV1_COMP *cpi, const MACROBLOCK *x,
                             const PC_TREE *pc_tree, int pb_source_variance,
                             int64_t best_rdcost,
                             const RD_RECT_PART_WIN_INFO *rect_part_win_info,
                             bool ext_partition_allowed,
                             PartitionSearchState *part_state,
                             int *ab_partitions_allowed) {
  int64_t *horz_rd = part_state->rect_part_rd[HORZ];
  int64_t *vert_rd = part_state->rect_part_rd[VERT];
  int64_t *split_rd = part_state->split_rd;
  const PartitionCfg *const part_cfg = &cpi->oxcf.part_cfg;
  // The standard AB partitions are allowed initially if ext-partition-types are
  // allowed.
  int horzab_partition_allowed = ext_partition_allowed &&
                                 part_cfg->enable_ab_partitions &&
                                 part_state->partition_rect_allowed[HORZ];
  int vertab_partition_allowed = ext_partition_allowed &&
                                 part_cfg->enable_ab_partitions &&
                                 part_state->partition_rect_allowed[VERT];

  // Pruning: pruning out AB partitions on one main direction based on the
  // current best partition and source variance.
  if (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
    if (cpi->sf.part_sf.prune_ext_partition_types_search_level == 1) {
      // TODO(debargha,huisu@google.com): may need to tune the threshold for
      // pb_source_variance.
      horzab_partition_allowed &= (pc_tree->partitioning == PARTITION_HORZ ||
                                   (pc_tree->partitioning == PARTITION_NONE &&
                                    pb_source_variance < 32) ||
                                   pc_tree->partitioning == PARTITION_SPLIT);
      vertab_partition_allowed &= (pc_tree->partitioning == PARTITION_VERT ||
                                   (pc_tree->partitioning == PARTITION_NONE &&
                                    pb_source_variance < 32) ||
                                   pc_tree->partitioning == PARTITION_SPLIT);
    } else {
      horzab_partition_allowed &= (pc_tree->partitioning == PARTITION_HORZ ||
                                   pc_tree->partitioning == PARTITION_SPLIT);
      vertab_partition_allowed &= (pc_tree->partitioning == PARTITION_VERT ||
                                   pc_tree->partitioning == PARTITION_SPLIT);
    }
    horz_rd[0] = (horz_rd[0] < INT64_MAX ? horz_rd[0] : 0);
    horz_rd[1] = (horz_rd[1] < INT64_MAX ? horz_rd[1] : 0);
    vert_rd[0] = (vert_rd[0] < INT64_MAX ? vert_rd[0] : 0);
    vert_rd[1] = (vert_rd[1] < INT64_MAX ? vert_rd[1] : 0);
    split_rd[0] = (split_rd[0] < INT64_MAX ? split_rd[0] : 0);
    split_rd[1] = (split_rd[1] < INT64_MAX ? split_rd[1] : 0);
    split_rd[2] = (split_rd[2] < INT64_MAX ? split_rd[2] : 0);
    split_rd[3] = (split_rd[3] < INT64_MAX ? split_rd[3] : 0);
  }

  // Pruning: pruning out horz_a or horz_b if the combined rdcost of its
  // subblocks estimated from previous partitions is much higher than the best
  // rd so far.
  ab_partitions_allowed[HORZ_A] = horzab_partition_allowed;
  ab_partitions_allowed[HORZ_B] = horzab_partition_allowed;
  if (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
    const int64_t horz_a_rd = horz_rd[1] + split_rd[0] + split_rd[1];
    const int64_t horz_b_rd = horz_rd[0] + split_rd[2] + split_rd[3];
    switch (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
      case 1:
        ab_partitions_allowed[HORZ_A] &= (horz_a_rd / 16 * 14 < best_rdcost);
        ab_partitions_allowed[HORZ_B] &= (horz_b_rd / 16 * 14 < best_rdcost);
        break;
      case 2:
      default:
        ab_partitions_allowed[HORZ_A] &= (horz_a_rd / 16 * 15 < best_rdcost);
        ab_partitions_allowed[HORZ_B] &= (horz_b_rd / 16 * 15 < best_rdcost);
        break;
    }
  }

  // Pruning: pruning out vert_a or vert_b if the combined rdcost of its
  // subblocks estimated from previous partitions is much higher than the best
  // rd so far.
  ab_partitions_allowed[VERT_A] = vertab_partition_allowed;
  ab_partitions_allowed[VERT_B] = vertab_partition_allowed;
  if (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
    const int64_t vert_a_rd = vert_rd[1] + split_rd[0] + split_rd[2];
    const int64_t vert_b_rd = vert_rd[0] + split_rd[1] + split_rd[3];
    switch (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
      case 1:
        ab_partitions_allowed[VERT_A] &= (vert_a_rd / 16 * 14 < best_rdcost);
        ab_partitions_allowed[VERT_B] &= (vert_b_rd / 16 * 14 < best_rdcost);
        break;
      case 2:
      default:
        ab_partitions_allowed[VERT_A] &= (vert_a_rd / 16 * 15 < best_rdcost);
        ab_partitions_allowed[VERT_B] &= (vert_b_rd / 16 * 15 < best_rdcost);
        break;
    }
  }

  // Pruning: pruning out some ab partitions using a DNN taking rd costs of
  // sub-blocks from previous basic partition types.
  if (cpi->sf.part_sf.ml_prune_partition && ext_partition_allowed &&
      part_state->partition_rect_allowed[HORZ] &&
      part_state->partition_rect_allowed[VERT]) {
    // TODO(huisu@google.com): x->source_variance may not be the current
    // block's variance. The correct one to use is pb_source_variance. Need to
    // re-train the model to fix it.
    ml_prune_ab_partition(cpi, pc_tree->partitioning,
                          get_unsigned_bits(x->source_variance), best_rdcost,
                          part_state, ab_partitions_allowed);
  }

  // Pruning: pruning AB partitions based on the number of horz/vert wins
  // in the current block and sub-blocks in PARTITION_SPLIT.
  if (cpi->sf.part_sf.prune_ext_part_using_split_info >= 2 &&
      ab_partitions_allowed[HORZ_A]) {
    ab_partitions_allowed[HORZ_A] &= evaluate_ab_partition_based_on_split(
        pc_tree, PARTITION_HORZ, rect_part_win_info, x->qindex, 0, 1);
  }
  if (cpi->sf.part_sf.prune_ext_part_using_split_info >= 2 &&
      ab_partitions_allowed[HORZ_B]) {
    ab_partitions_allowed[HORZ_B] &= evaluate_ab_partition_based_on_split(
        pc_tree, PARTITION_HORZ, rect_part_win_info, x->qindex, 2, 3);
  }
  if (cpi->sf.part_sf.prune_ext_part_using_split_info >= 2 &&
      ab_partitions_allowed[VERT_A]) {
    ab_partitions_allowed[VERT_A] &= evaluate_ab_partition_based_on_split(
        pc_tree, PARTITION_VERT, rect_part_win_info, x->qindex, 0, 2);
  }
  if (cpi->sf.part_sf.prune_ext_part_using_split_info >= 2 &&
      ab_partitions_allowed[VERT_B]) {
    ab_partitions_allowed[VERT_B] &= evaluate_ab_partition_based_on_split(
        pc_tree, PARTITION_VERT, rect_part_win_info, x->qindex, 1, 3);
  }
}